

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
::erase(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
        *this,iterator p)

{
  range_type *prVar1;
  iterator pcVar2;
  
  if (p == (iterator)0x0) {
    pcVar2 = (iterator)0x0;
  }
  else {
    prVar1 = basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
             ::
             get<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>>
                       ((basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
                         *)this,(basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
                                 *)p);
    if (prVar1->first == prVar1->second) {
      prVar1->first = (container *)0x0;
      prVar1->second = (container *)0x0;
    }
    else if (prVar1->first == p) {
      prVar1->first = p->next;
    }
    else if (prVar1->second == p) {
      prVar1->second = p->prev;
    }
    pcVar2 = p->next;
    intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::container>
    ::erase(&this->list_,p);
    this->size_ = this->size_ - 1;
    destroy(this,p);
  }
  return pcVar2;
}

Assistant:

iterator erase(iterator p)
	{
		if(p==0)
			return 0;
		range_type &r = get(p->val.first);
		if(r.first == r.second) {
			assert(p == r.first);
			r.first = r.second = 0;
		}
		else if(r.first == p)
			r.first = p->next;
		else if(r.second == p)
			r.second = p->prev;
		iterator next = p->next;
		list_.erase(p);
		size_ --;
		destroy(p);
		return next;
	}